

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

bool baryonyx::itm::
     is_valid_constraint<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
               (solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                *slv,int k,bit_array *x)

{
  bound_factor *pbVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  long in_R9;
  long in_R10;
  undefined1 auVar8 [16];
  undefined1 auVar10 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar9 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar29 [64];
  undefined1 local_30 [16];
  undefined1 auVar11 [32];
  undefined1 auVar14 [32];
  
  sparse_matrix<int>::row((sparse_matrix<int> *)local_30,(int)slv + 0x10);
  if (local_30._8_8_ == local_30._0_8_) {
    iVar21 = 0;
  }
  else {
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
    auVar14._8_4_ = 0xffffffc0;
    auVar14._0_8_ = 0xffffffc0ffffffc0;
    auVar14._12_4_ = 0xffffffc0;
    auVar14._16_4_ = 0xffffffc0;
    auVar14._20_4_ = 0xffffffc0;
    auVar14._24_4_ = 0xffffffc0;
    auVar14._28_4_ = 0xffffffc0;
    auVar16 = vpbroadcastq_avx512f(ZEXT816(1));
    lVar6 = local_30._0_8_ - local_30._8_8_;
    uVar7 = 0;
    auVar17 = vpbroadcastq_avx512f();
    auVar17 = vpsrlq_avx512f(auVar17,3);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar18 = vpbroadcastq_avx512f();
      uVar7 = uVar7 + 8;
      auVar18 = vporq_avx512f(auVar18,auVar15);
      uVar3 = vpcmpuq_avx512f(auVar18,auVar17,2);
      auVar9 = vpgatherdd_avx512vl(*(undefined4 *)(local_30._8_8_ + (long)slv));
      bVar2 = (byte)uVar3;
      auVar10._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar9._4_4_;
      auVar10._0_4_ = (uint)(bVar2 & 1) * auVar9._0_4_;
      auVar10._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar9._8_4_;
      auVar10._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar9._12_4_;
      auVar10._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar9._16_4_;
      auVar10._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar9._20_4_;
      auVar10._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar9._24_4_;
      auVar10._28_4_ = (uint)(byte)(uVar3 >> 7) * auVar9._28_4_;
      auVar9 = vpsrad_avx2(auVar10,0x1f);
      auVar9 = vpsrld_avx2(auVar9,0x1a);
      auVar9 = vpaddd_avx2(auVar9,auVar10);
      vpsrad_avx2(auVar9,6);
      auVar9 = vpand_avx2(auVar9,auVar14);
      auVar9 = vpsubd_avx2(auVar10,auVar9);
      auVar18 = vpgatherdq_avx512f((int)(slv->A).super_bit_array_impl.m_data._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                        .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                        [in_R9]);
      auVar19._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar18._8_8_;
      auVar19._0_8_ = (ulong)(bVar2 & 1) * auVar18._0_8_;
      auVar19._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar18._16_8_;
      auVar19._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar18._24_8_;
      auVar19._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar18._32_8_;
      auVar19._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar18._40_8_;
      auVar19._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar18._48_8_;
      auVar19._56_8_ = (uVar3 >> 7) * auVar18._56_8_;
      auVar10 = vpgatherdd_avx512vl(*(undefined4 *)
                                     ((long)&(slv->super_debug_logger<false>).ofs +
                                     local_30._8_8_ + 4));
      auVar11._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar10._4_4_;
      auVar11._0_4_ = (uint)(bVar2 & 1) * auVar10._0_4_;
      auVar11._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar10._8_4_;
      auVar11._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar10._12_4_;
      auVar11._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar10._16_4_;
      auVar11._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar10._20_4_;
      auVar11._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar10._24_4_;
      auVar11._28_4_ = (uint)(byte)(uVar3 >> 7) * auVar10._28_4_;
      auVar18 = vpmovzxdq_avx512f(auVar9);
      local_30._8_8_ = local_30._8_8_ + 0x40;
      auVar18 = vpsrlvq_avx512f(auVar19,auVar18);
      auVar9 = vpsrad_avx2(auVar11,0x1f);
      vpandq_avx512f(auVar18,auVar16);
      auVar9 = vpsrld_avx2(auVar9,0x1a);
      auVar9 = vpaddd_avx2(auVar11,auVar9);
      vpsrad_avx2(auVar9,6);
      auVar9 = vpand_avx2(auVar9,auVar14);
      auVar18 = vpgatherdq_avx512f((int)(x->super_bit_array_impl).m_data._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                        .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                                        [in_R10]);
      auVar20._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar18._8_8_;
      auVar20._0_8_ = (ulong)(bVar2 & 1) * auVar18._0_8_;
      auVar20._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar18._16_8_;
      auVar20._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar18._24_8_;
      auVar20._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar18._32_8_;
      auVar20._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar18._40_8_;
      auVar20._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar18._48_8_;
      auVar20._56_8_ = (uVar3 >> 7) * auVar18._56_8_;
      auVar9 = vpsubd_avx2(auVar11,auVar9);
      auVar18 = vpmovzxdq_avx512f(auVar9);
      auVar9 = vpgatherqd_avx512f(*(undefined8 *)(value_bit_array<-1,_1>::return_value + uVar7));
      auVar12._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar9._4_4_;
      auVar12._0_4_ = (uint)(bVar2 & 1) * auVar9._0_4_;
      auVar12._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar9._8_4_;
      auVar12._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar9._12_4_;
      auVar12._16_4_ = (uint)((byte)(uVar3 >> 4) & 1) * auVar9._16_4_;
      auVar12._20_4_ = (uint)((byte)(uVar3 >> 5) & 1) * auVar9._20_4_;
      auVar12._24_4_ = (uint)((byte)(uVar3 >> 6) & 1) * auVar9._24_4_;
      auVar12._28_4_ = (uint)(byte)(uVar3 >> 7) * auVar9._28_4_;
      auVar18 = vpsrlvq_avx512f(auVar20,auVar18);
      uVar4 = vptestmq_avx512f(auVar18,auVar16);
      auVar9 = vpaddd_avx512vl(auVar29._0_32_,auVar12);
      bVar5 = (bool)((byte)uVar4 & 1);
      iVar21 = auVar29._0_4_;
      auVar13._0_4_ = (uint)bVar5 * auVar9._0_4_ | (uint)!bVar5 * iVar21;
      bVar5 = (bool)((byte)(uVar4 >> 1) & 1);
      iVar22 = auVar29._4_4_;
      auVar13._4_4_ = (uint)bVar5 * auVar9._4_4_ | (uint)!bVar5 * iVar22;
      bVar5 = (bool)((byte)(uVar4 >> 2) & 1);
      iVar23 = auVar29._8_4_;
      auVar13._8_4_ = (uint)bVar5 * auVar9._8_4_ | (uint)!bVar5 * iVar23;
      bVar5 = (bool)((byte)(uVar4 >> 3) & 1);
      iVar24 = auVar29._12_4_;
      auVar13._12_4_ = (uint)bVar5 * auVar9._12_4_ | (uint)!bVar5 * iVar24;
      bVar5 = (bool)((byte)(uVar4 >> 4) & 1);
      iVar25 = auVar29._16_4_;
      auVar13._16_4_ = (uint)bVar5 * auVar9._16_4_ | (uint)!bVar5 * iVar25;
      bVar5 = (bool)((byte)(uVar4 >> 5) & 1);
      iVar26 = auVar29._20_4_;
      auVar13._20_4_ = (uint)bVar5 * auVar9._20_4_ | (uint)!bVar5 * iVar26;
      bVar5 = (bool)((byte)(uVar4 >> 6) & 1);
      iVar27 = auVar29._24_4_;
      auVar13._24_4_ = (uint)bVar5 * auVar9._24_4_ | (uint)!bVar5 * iVar27;
      bVar5 = SUB81(uVar4 >> 7,0);
      iVar28 = auVar29._28_4_;
      auVar13._28_4_ = (uint)bVar5 * auVar9._28_4_ | (uint)!bVar5 * iVar28;
      auVar29 = ZEXT3264(auVar13);
    } while (((lVar6 - 8U >> 3) + 8 & 0xfffffffffffffff8) != uVar7);
    auVar14 = vmovdqa32_avx512vl(auVar13);
    auVar8._0_4_ = (uint)(bVar2 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar2 & 1) * iVar21;
    bVar5 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar8._4_4_ = (uint)bVar5 * auVar14._4_4_ | (uint)!bVar5 * iVar22;
    bVar5 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar8._8_4_ = (uint)bVar5 * auVar14._8_4_ | (uint)!bVar5 * iVar23;
    bVar5 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar8._12_4_ = (uint)bVar5 * auVar14._12_4_ | (uint)!bVar5 * iVar24;
    bVar5 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar9._16_4_ = (uint)bVar5 * auVar14._16_4_ | (uint)!bVar5 * iVar25;
    auVar9._0_16_ = auVar8;
    bVar5 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar9._20_4_ = (uint)bVar5 * auVar14._20_4_ | (uint)!bVar5 * iVar26;
    bVar5 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar9._24_4_ = (uint)bVar5 * auVar14._24_4_ | (uint)!bVar5 * iVar27;
    bVar5 = SUB81(uVar3 >> 7,0);
    auVar9._28_4_ = (uint)bVar5 * auVar14._28_4_ | (uint)!bVar5 * iVar28;
    auVar8 = vphaddd_avx(auVar9._16_16_,auVar8);
    auVar8 = vphaddd_avx(auVar8,auVar8);
    auVar8 = vphaddd_avx(auVar8,auVar8);
    iVar21 = auVar8._0_4_;
  }
  pbVar1 = (slv->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::bound_factor_*,_false>
           ._M_head_impl;
  if (iVar21 < pbVar1[k].min) {
    bVar5 = false;
  }
  else {
    bVar5 = iVar21 <= pbVar1[k].max;
  }
  return bVar5;
}

Assistant:

bool
is_valid_constraint(const Solver& slv, int k, const Xtype& x)
{
    typename sparse_matrix<int>::const_row_iterator it, et;

    std::tie(it, et) = slv.ap.row(k);
    int v = 0;

    for (; it != et; ++it)
        v += slv.factor(it->value) * x[it->column];

    return slv.bound_min(k) <= v && v <= slv.bound_max(k);
}